

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerDropout.cpp
# Opt level: O0

void __thiscall tfs::DnnLayerDropout::setup(DnnLayerDropout *this,bool trainable)

{
  bool bVar1;
  TMatrix<double> *pTVar2;
  void *pvVar3;
  unsigned_long uVar4;
  byte in_SIL;
  long in_RDI;
  unsigned_long ii;
  unsigned_long count;
  Matrix *in_stack_ffffffffffffffb0;
  undefined1 copyOther;
  TMatrix<double> *in_stack_ffffffffffffffc0;
  ulong local_30;
  
  bVar1 = matrixBad(in_stack_ffffffffffffffb0);
  if (bVar1) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerDropout.cpp"
                   ,"setup",0x27,"Input activation matrix is bad");
    return;
  }
  if (((in_SIL & 1) != 0) && (*(long *)(in_RDI + 0x18) != 0)) {
    bVar1 = matrixBad(in_stack_ffffffffffffffb0);
    if (bVar1) {
      report_problem("Error",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerDropout.cpp"
                     ,"setup",0x2c,"Input dw matrix is bad");
      return;
    }
    in_stack_ffffffffffffffc0 =
         (TMatrix<double> *)TMatrix<double>::count(*(TMatrix<double> **)(in_RDI + 0x10));
    pTVar2 = (TMatrix<double> *)TMatrix<double>::count(*(TMatrix<double> **)(in_RDI + 0x18));
    if (in_stack_ffffffffffffffc0 != pTVar2) {
      report_problem("Error",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerDropout.cpp"
                     ,"setup",0x30,"in_a != in_dw size");
      return;
    }
  }
  copyOther = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  pTVar2 = (TMatrix<double> *)operator_new(0x50);
  TMatrix<double>::TMatrix(in_stack_ffffffffffffffc0,pTVar2,(bool)copyOther);
  *(TMatrix<double> **)(in_RDI + 0x40) = pTVar2;
  if ((in_SIL & 1) != 0) {
    pvVar3 = operator_new(0x50);
    TMatrix<double>::TMatrix(in_stack_ffffffffffffffc0,pTVar2,SUB81((ulong)pvVar3 >> 0x38,0));
    *(void **)(in_RDI + 0x48) = pvVar3;
  }
  uVar4 = TMatrix<double>::count(*(TMatrix<double> **)(in_RDI + 0x40));
  pvVar3 = operator_new__(uVar4);
  *(void **)(in_RDI + 0x78) = pvVar3;
  for (local_30 = 0; local_30 < uVar4; local_30 = local_30 + 1) {
    *(undefined1 *)(*(long *)(in_RDI + 0x78) + local_30) = 0;
  }
  return;
}

Assistant:

void
    DnnLayerDropout::setup( const bool trainable ) {
        // -----------------------------------------------------------------------------------
        // S = size of input data
        // out_a[S]  = activations of each neuron
        // out_dw[S] = gradient
        // -----------------------------------------------------------------------------------
        if( matrixBad( m_in_a )) {
            log_error( "Input activation matrix is bad" );
            return;
        }
        if( trainable && m_in_dw != 0 ) {       // Input layers can have null m_out_dw
            if( matrixBad( m_in_dw )) {
                log_error( "Input dw matrix is bad" );
                return;
            }
            if( m_in_a->count() != m_in_dw->count()) {  // By default, we expect the dimensions to be the same.
                log_error( "in_a != in_dw size" );
                return;
            }
        }
        m_out_a = new Matrix( *m_in_a );         // Output dimension matches input dimension
        if( trainable ) {
            m_out_dw = new Matrix( *m_out_a );   // Output dimension matches input dimension
        }
        const unsigned long count = m_out_a->count();
        m_dropped = new bool[ count ];
        for( unsigned long ii = 0; ii < count; ii++ ) {
            m_dropped[ii] = false;
        }
        return;
    }